

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

string * __thiscall
optimization::global_expr_move::Global_Expr_Mov::pass_name_abi_cxx11_(Global_Expr_Mov *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x10));
  return in_RDI;
}

Assistant:

std::string pass_name() const { return name; }